

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseInlineQueryResultAudio_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"audio_url",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->
                   super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->audioUrl);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"performer",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->
                   super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->performer);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"audio_duration",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->
                        super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->audioDuration);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInlineQueryResultAudio(const InlineQueryResultAudio::Ptr& object) const {
    if (!object){
        return "";
    }
    // This function will be called by parseInlineQueryResult(), so I don't add
    // curly brackets to the result string.
    string result;
    appendToJson(result, "audio_url", object->audioUrl);
    appendToJson(result, "performer", object->performer);
    appendToJson(result, "audio_duration", object->audioDuration);
    // The last comma will be erased by parseInlineQueryResult().
    return result;
}